

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_slay(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *__s1;
  void *pvVar3;
  uint local_2c;
  wchar_t i;
  char *s;
  artifact *a;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  __s1 = parser_getstr(p,"code");
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    local_2c = 1;
    while (((int)local_2c < (int)(uint)z_info->slay_max &&
           (iVar1 = strcmp(__s1,slays[(int)local_2c].code), iVar1 != 0))) {
      local_2c = local_2c + 1;
    }
    if (local_2c == z_info->slay_max) {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SLAY;
    }
    else {
      if (*(long *)((long)pvVar2 + 0xe0) == 0) {
        pvVar3 = mem_zalloc((ulong)z_info->slay_max);
        *(void **)((long)pvVar2 + 0xe0) = pvVar3;
      }
      *(undefined1 *)(*(long *)((long)pvVar2 + 0xe0) + (long)(int)local_2c) = 1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_slay(struct parser *p) {
	struct artifact *a = parser_priv(p);
	const char *s = parser_getstr(p, "code");
	int i;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->slay_max; i++) {
		if (streq(s, slays[i].code)) break;
	}
	if (i == z_info->slay_max) {
		return PARSE_ERROR_UNRECOGNISED_SLAY;
	}
	if (!a->slays) {
		a->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	}
	a->slays[i] = true;
	return PARSE_ERROR_NONE;
}